

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O3

void TestBlockWrite(uint wlen_max,AmpIO *wboard,AmpIO *rboard)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ostream *poVar8;
  ulong uVar9;
  ushort uVar10;
  uint offset;
  char cVar11;
  unsigned_short nquads;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  double dVar17;
  int iVar19;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined1 auVar27 [16];
  int iVar28;
  quadlet_t waveform_read [512];
  quadlet_t waveform [512];
  int local_1090;
  long local_1058;
  quadlet_t local_1038 [8];
  uint local_1018;
  quadlet_t local_ff8 [4];
  ushort local_fe6;
  quadlet_t local_838;
  uint local_834 [513];
  long lVar21;
  
  uVar5 = BoardIO::GetFpgaVersionMajor((BoardIO *)rboard);
  if ((uVar5 & 0xfffffffe) != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TestBlockWrite: unsupported FPGA Version: ",0x2a);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    return;
  }
  bVar3 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,local_1038,0x80,0x10);
  bVar1 = true;
  if (bVar3) {
    if (local_1038[0] == 0x32474244) {
      bVar1 = false;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Debug data not available",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Will only perform read/write test",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      bVar1 = true;
      std::ostream::put(-0x20);
      std::ostream::flush();
    }
  }
  if (2 < wlen_max) {
    uVar6 = wlen_max - 1;
    offset = 0x4a0;
    if (uVar5 == 2) {
      offset = 0x90;
    }
    uVar7 = wlen_max - 2;
    uVar14 = 0;
    uVar13 = 2;
    local_1058 = 5;
    uVar10 = 0;
    local_1090 = 0;
    do {
      bVar3 = uVar13 < 10;
      iVar12 = (int)uVar13;
      bVar15 = ((uint)(iVar12 * -0x33333333) >> 2 | iVar12 * 0x40000000) < 0xccccccd;
      bVar16 = uVar13 == uVar6;
      if (uVar5 == 2) {
        dVar17 = (double)(iVar12 * 3 - 2) / 5.0;
      }
      else {
        dVar17 = (double)(iVar12 - 1) * 0.5;
      }
      if (bVar15 || (bVar3 || bVar16)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Len=",4);
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
        if (!bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"trigger = ",10);
          poVar8 = std::ostream::_M_insert<double>(dVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", trigger_fpga = ",0x11);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        }
      }
      memset(local_1038,0,uVar14 * 4 + 8);
      lVar21 = uVar13 - 1;
      auVar18._8_4_ = (int)lVar21;
      auVar18._0_8_ = lVar21;
      auVar18._12_4_ = (int)((ulong)lVar21 >> 0x20);
      auVar18 = auVar18 ^ _DAT_00120070;
      uVar9 = 0;
      iVar23 = 0;
      iVar24 = 1;
      iVar25 = 2;
      iVar26 = 3;
      auVar20 = _DAT_001200b0;
      auVar22 = _DAT_001200a0;
      do {
        auVar27 = auVar20 ^ _DAT_00120070;
        iVar19 = auVar18._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar19 && auVar18._0_4_ < auVar27._0_4_ ||
                    iVar19 < auVar27._4_4_) & 1)) {
          *(int *)((long)&local_838 + uVar9) = iVar12 - iVar23 | (iVar23 + iVar12) * 0x10000;
        }
        if ((auVar27._12_4_ != auVar18._12_4_ || auVar27._8_4_ <= auVar18._8_4_) &&
            auVar27._12_4_ <= auVar18._12_4_) {
          *(int *)((long)local_834 + uVar9) = iVar12 - iVar24 | (iVar24 + iVar12) * 0x10000;
        }
        iVar28 = SUB164(auVar22 ^ _DAT_00120070,4);
        if (iVar28 <= iVar19 &&
            (iVar28 != iVar19 || SUB164(auVar22 ^ _DAT_00120070,0) <= auVar18._0_4_)) {
          *(int *)((long)local_834 + uVar9 + 4) = iVar12 - iVar25 | (iVar25 + iVar12) * 0x10000;
          *(int *)((long)local_834 + uVar9 + 8) = iVar12 - iVar26 | (iVar26 + iVar12) * 0x10000;
        }
        lVar21 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar21 + 4;
        lVar21 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 4;
        auVar22._8_8_ = lVar21 + 4;
        iVar23 = iVar23 + 4;
        iVar24 = iVar24 + 4;
        iVar25 = iVar25 + 4;
        iVar26 = iVar26 + 4;
        uVar9 = uVar9 + 0x10;
      } while ((local_1058 * 4 & 0xfffffffffffffff0U) != uVar9);
      nquads = (unsigned_short)uVar13;
      bVar4 = AmpIO::WriteWaveformTable(wboard,&local_838,0,nquads);
      if (!bVar4) {
        if (!bVar15 && (!bVar3 && !bVar16)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Len=",4);
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2
          ;
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"WriteWaveformTable failed",0x19);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        cVar11 = -0x20;
        goto LAB_00109b80;
      }
      Amp1394_Sleep(0.05);
      if (bVar1) {
        bVar4 = AmpIO::ReadWaveformTable(rboard,local_1038,0,nquads);
        if (!bVar4) {
          if (!bVar15 && (!bVar3 && !bVar16)) {
LAB_0010997d:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Len=",4);
            *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
                 2;
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
          }
LAB_001099c6:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ReadWaveformTable failed",0x18);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
          std::ostream::put(-0x20);
          std::ostream::flush();
          break;
        }
      }
      else {
        bVar4 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,local_1038,0x80,0x10);
        if ((!bVar4) ||
           (bVar4 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,local_ff8,offset,5),
           uVar2 = local_1018, !bVar4)) break;
        if (local_1018 >> 0x10 < wlen_max) {
          wlen_max = local_1018 >> 0x10;
        }
        if (uVar10 < local_fe6) {
          uVar10 = local_fe6;
        }
        if (bVar15 || (bVar3 || bVar16)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bw_left = ",10);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", bw_wait = ",0xc);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          if ((short)uVar2 < 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,", bw_err_cnt = ",0xf);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
          bVar4 = AmpIO::ReadWaveformTable(rboard,local_1038,0,nquads);
          if (!bVar4) goto LAB_001099c6;
        }
        else {
          bVar4 = AmpIO::ReadWaveformTable(rboard,local_1038,0,nquads);
          if (!bVar4) goto LAB_0010997d;
        }
      }
      uVar9 = 0;
      do {
        if (local_1038[uVar9] != (&local_838)[uVar9]) {
          if (bVar15 || (bVar3 || bVar16)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"mismatch at quadlet ",0x14);
            *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
                 2;
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", read ",7);
            *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                 *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", expected ",0xb);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            bVar3 = local_1090 != 0;
            local_1090 = 0;
            if (bVar3) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
              std::ostream::put(-0x20);
              poVar8 = (ostream *)std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"There were ",0xb);
              *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                   *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," additional lengths with mismatches",0x23);
            }
            goto LAB_00109898;
          }
          local_1090 = local_1090 + 1;
          goto LAB_001098c7;
        }
        uVar9 = uVar9 + 1;
      } while (uVar13 != uVar9);
      if (bVar15 || (bVar3 || bVar16)) {
        if (bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Pass",5);
        }
LAB_00109898:
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
      }
LAB_001098c7:
      uVar13 = uVar13 + 1;
      uVar14 = uVar14 + 1;
      local_1058 = local_1058 + 1;
    } while (uVar14 != uVar7);
    if (local_1090 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"There were ",0xb);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," additional lengths with mismatches",0x23);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
  }
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mininum bw_left = ",0x12);
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," at wlen = ",0xb);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Maximum bw_wait = ",0x12);
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," at wlen = ",0xb);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    cVar11 = (char)poVar8;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar11);
LAB_00109b80:
    std::ostream::put(cVar11);
    std::ostream::flush();
  }
  return;
}

Assistant:

void TestBlockWrite(unsigned int wlen_max, AmpIO *wboard, AmpIO *rboard)
{
    quadlet_t waveform[MAX_POSSIBLE_DATA_SIZE/sizeof(quadlet_t)];
    quadlet_t waveform_read[MAX_POSSIBLE_DATA_SIZE/sizeof(quadlet_t)];
    unsigned int i;
    unsigned int min_left = wlen_max;
    unsigned int min_wlen = wlen_max;
    unsigned int max_wait = 0;
    unsigned int max_wlen = wlen_max;
    unsigned int numSilentMismatch = 0;

    // Get FPGA Version
    unsigned int fpgaVer = rboard->GetFpgaVersionMajor();
    if ((fpgaVer < 2) || (fpgaVer > 3)) {
        std::cout << "TestBlockWrite: unsupported FPGA Version: " << fpgaVer << std::endl;
        return;
    }

    // Check if debug data available, in which case we can query bw_left
    unsigned int debugVersion = 0;
    if (rboard->ReadEthernetData(waveform_read, 0x80, 16)) {
        char *cptr = reinterpret_cast<char *>(waveform_read);
        if (strncmp(cptr, "DBG2", 4) == 0) {
            debugVersion = 2;
        }
        else {
            std::cout << "Debug data not available" << std::endl;
            std::cout << "Will only perform read/write test" << std::endl;
        }
    }

    for (unsigned int wlen = 2; wlen < wlen_max; wlen++) {
        bool doOut = ((wlen<10)||(wlen%20 == 0)||(wlen==wlen_max-1));
        unsigned int len16 = 2*wlen;  // length in words
        double trigger;               // actual trigger value
        unsigned int trigger_comp;    // trigger computation on FPGA
        if (fpgaVer == 2) {
            trigger_comp = 10 + len16/2+len16/8-len16/64 + 2; // FPGA V2 (KSZ8851)
            trigger = (3*wlen-2)/5.0;
        }
        else {
            trigger_comp = 10 + len16/2 + 2;   // FPGA V3 (RTL8211F)
            trigger = (wlen-1)/2.0;
        }
        if (doOut) {
            std::cout << "Len=" << std::dec << wlen << ": ";
            if (debugVersion) {
                std::cout << "trigger = " << trigger
                          << ", trigger_fpga = " << (trigger_comp-10)/2 << ", ";
            }
        }
        for (i = 0; i < wlen; i++) {
            waveform[i] = ((wlen+i)<< 16) | (wlen-i);
            waveform_read[i] = 0;
        }
        if (!wboard->WriteWaveformTable(waveform, 0, wlen)) {
            if (!doOut) std::cout << "Len=" << std::dec << wlen << ": ";
            std::cout << "WriteWaveformTable failed" << std::endl;
            return;
        }
        Amp1394_Sleep(0.05);
        if (debugVersion) {
            // Read 16 quadlets to get EthernetIO debug data (0x80-0x8f)
            if (!rboard->ReadEthernetData(waveform_read, 0x80, 16))
                break;
            // Read next 5 quadlets to get low-level debug data:
            // KSZ (0x90) or RTI (0x4a0)
            if (!rboard->ReadEthernetData(&waveform_read[16], (fpgaVer == 2) ? 0x90 : 0x4a0, 5))
                break;
            unsigned short bw_left = 0;
            unsigned short bw_wait = 0;
            unsigned int bw_err_cnt = 0;
            bw_left = static_cast<unsigned short>(waveform_read[8]>>16);
            bool bw_err = (waveform_read[8] & 0x00008000);
            if (bw_err) {
                bw_err_cnt++;
            }
            // For both KSZ and RTI, bw_wait is upper word of DebugData[4]
            bw_wait = static_cast<unsigned short>(waveform_read[20]>>16);
            if (bw_left < min_left) {
                min_left = bw_left;
                min_wlen = wlen;
            }
            if (bw_wait > max_wait) {
                max_wait = bw_wait;
                max_wlen = wlen;
            }
            if (doOut) {
                std::cout << "bw_left = " << bw_left << ", bw_wait = " << bw_wait;
                if (bw_err_cnt > 0) {
                    std::cout << ", bw_err_cnt = " << bw_err_cnt;
                    bw_err_cnt = 0;
                }
                std::cout << ", ";
            }
        }
        if (!rboard->ReadWaveformTable(waveform_read, 0, wlen)) {
            if (!doOut) std::cout << "Len=" << std::dec << wlen << ": ";
            std::cout << "ReadWaveformTable failed" << std::endl;
            break;
        }
        bool allOK = true;
        for (i = 0; i < wlen; i++) {
            if (waveform_read[i] != waveform[i]) {
                allOK = false;
                if (doOut) {
                    std::cout << "mismatch at quadlet " << std::dec << i << ", read "
                              << std::hex << waveform_read[i] << ", expected " << waveform[i];
                    if (numSilentMismatch > 0) {
                        std::cout << std::endl << "There were " << std::dec << numSilentMismatch
                                  << " additional lengths with mismatches";
                        numSilentMismatch = 0;
                    }
                }
                else
                    numSilentMismatch++;
                break;
            }
        }
        if (doOut) {
            if (!debugVersion && allOK) std::cout << " Pass";
            std::cout << std::endl;
        }
    }
    if (numSilentMismatch > 0) {
        std::cout << "There were " << numSilentMismatch << " additional lengths with mismatches" << std::endl;
    }
    if (debugVersion) {
        std::cout << "Mininum bw_left = " << std::dec << min_left << " at wlen = " << min_wlen << std::endl;
        std::cout << "Maximum bw_wait = " << std::dec << max_wait << " at wlen = " << max_wlen << std::endl;
    }
}